

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O3

bool benchmark::CpuScalingEnabled(void)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  int iVar3;
  char (*in_R8) [26];
  bool bVar4;
  int cpu;
  char buff [16];
  string governor_file;
  int local_6c;
  char local_68 [3];
  char acStack_65 [5];
  char acStack_60 [16];
  string local_50;
  
  local_6c = 0;
  std::call_once<void(&)()>
            ((once_flag *)&(anonymous_namespace)::cpuinfo_init,anon_unknown_1::InitializeSystemInfo)
  ;
  iVar1 = (anonymous_namespace)::cpuinfo_num_cpus;
  if ((anonymous_namespace)::cpuinfo_num_cpus < 1) {
    bVar4 = false;
  }
  else {
    do {
      StrCat<char_const(&)[28],int&,char_const(&)[26]>
                (&local_50,(benchmark *)"/sys/devices/system/cpu/cpu",(char (*) [28])&local_6c,
                 (int *)"/cpufreq/scaling_governor",in_R8);
      __stream = fopen(local_50._M_dataplus._M_p,"r");
      if (__stream == (FILE *)0x0) {
        iVar3 = 2;
      }
      else {
        sVar2 = fread(local_68,1,0x10,__stream);
        fclose(__stream);
        if ((sVar2 < 0xb) ||
           (CONCAT35(acStack_60._0_3_,acStack_65) != 0x65636e616d726f66 ||
            CONCAT53(acStack_65,local_68) != 0x616d726f66726570)) {
          iVar3 = 1;
        }
        else {
          iVar3 = 0;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (iVar3 != 0) goto LAB_0010fac5;
      local_6c = local_6c + 1;
    } while (local_6c < iVar1);
    iVar3 = 2;
LAB_0010fac5:
    bVar4 = iVar3 != 2;
  }
  return bVar4;
}

Assistant:

bool CpuScalingEnabled() {
#ifndef BENCHMARK_OS_WINDOWS
  // On Linux, the CPUfreq subsystem exposes CPU information as files on the
  // local file system. If reading the exported files fails, then we may not be
  // running on Linux, so we silently ignore all the read errors.
  for (int cpu = 0, num_cpus = NumCPUs(); cpu < num_cpus; ++cpu) {
    std::string governor_file = StrCat("/sys/devices/system/cpu/cpu", cpu,
                                       "/cpufreq/scaling_governor");
    FILE* file = fopen(governor_file.c_str(), "r");
    if (!file) break;
    char buff[16];
    size_t bytes_read = fread(buff, 1, sizeof(buff), file);
    fclose(file);
    if (memprefix(buff, bytes_read, "performance") == nullptr) return true;
  }
#endif
  return false;
}